

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O1

ImGuiTable * __thiscall ImPool<ImGuiTable>::Add(ImPool<ImGuiTable> *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  ImGuiTable *pIVar4;
  ImGuiID IVar5;
  ImGuiTable *pIVar6;
  int iVar7;
  
  iVar2 = this->FreeIdx;
  iVar7 = (this->Buf).Size;
  if (iVar2 == iVar7) {
    iVar1 = iVar7 + 1;
    iVar3 = (this->Buf).Capacity;
    if (iVar3 <= iVar7) {
      if (iVar3 == 0) {
        iVar7 = 8;
      }
      else {
        iVar7 = iVar3 / 2 + iVar3;
      }
      if (iVar7 <= iVar1) {
        iVar7 = iVar1;
      }
      if (iVar3 < iVar7) {
        pIVar6 = (ImGuiTable *)ImGui::MemAlloc((long)iVar7 * 0x218);
        pIVar4 = (this->Buf).Data;
        if (pIVar4 != (ImGuiTable *)0x0) {
          memcpy(pIVar6,pIVar4,(long)(this->Buf).Size * 0x218);
          ImGui::MemFree((this->Buf).Data);
        }
        (this->Buf).Data = pIVar6;
        (this->Buf).Capacity = iVar7;
      }
    }
    (this->Buf).Size = iVar1;
    IVar5 = this->FreeIdx + 1;
  }
  else {
    IVar5 = (this->Buf).Data[iVar2].ID;
  }
  this->FreeIdx = IVar5;
  pIVar4 = (this->Buf).Data;
  pIVar4[iVar2].ColumnsNames.Buf.Size = 0;
  pIVar4[iVar2].ColumnsNames.Buf.Capacity = 0;
  pIVar4[iVar2].ColumnsNames.Buf.Data = (char *)0x0;
  pIVar4[iVar2].Columns.Data = (ImGuiTableColumn *)0x0;
  pIVar4[iVar2].Columns.DataEnd = (ImGuiTableColumn *)0x0;
  pIVar4[iVar2].DisplayOrderToIndex.Data = (char *)0x0;
  pIVar4[iVar2].DisplayOrderToIndex.DataEnd = (char *)0x0;
  pIVar4[iVar2].RowCellData.Data = (ImGuiTableCellData *)0x0;
  pIVar4[iVar2].RowCellData.DataEnd = (ImGuiTableCellData *)0x0;
  memset(&pIVar4[iVar2].OuterRect,0,0x90);
  pIVar4[iVar2].InstanceDataFirst.LastOuterHeight = 0.0;
  pIVar4[iVar2].InstanceDataFirst.LastFirstRowHeight = 0.0;
  pIVar4[iVar2].InstanceDataExtra.Size = 0;
  pIVar4[iVar2].InstanceDataExtra.Capacity = 0;
  pIVar4[iVar2].InstanceDataExtra.Data = (ImGuiTableInstanceData *)0x0;
  pIVar6 = pIVar4 + iVar2;
  (pIVar6->SortSpecsSingle).ColumnUserID = 0;
  (pIVar6->SortSpecsSingle).ColumnIndex = 0;
  (pIVar6->SortSpecsSingle).SortOrder = 0;
  *(undefined4 *)&pIVar4[iVar2].SortSpecsSingle.field_0x8 = 0;
  pIVar4[iVar2].SortSpecsMulti.Size = 0;
  pIVar4[iVar2].SortSpecsMulti.Capacity = 0;
  pIVar4[iVar2].SortSpecsMulti.Data = (ImGuiTableColumnSortSpecs *)0x0;
  pIVar4[iVar2].SortSpecs.Specs = (ImGuiTableColumnSortSpecs *)0x0;
  pIVar6 = pIVar4 + iVar2;
  (pIVar6->SortSpecs).SpecsCount = 0;
  (pIVar6->SortSpecs).SpecsDirty = false;
  *(undefined3 *)&(pIVar6->SortSpecs).field_0xd = 0;
  memset(pIVar4 + iVar2,0,0x218);
  pIVar4[iVar2].LastFrameActive = -1;
  this->AliveCount = this->AliveCount + 1;
  return (this->Buf).Data + iVar2;
}

Assistant:

T*          Add()                               { int idx = FreeIdx; if (idx == Buf.Size) { Buf.resize(Buf.Size + 1); FreeIdx++; } else { FreeIdx = *(int*)&Buf[idx]; } IM_PLACEMENT_NEW(&Buf[idx]) T(); AliveCount++; return &Buf[idx]; }